

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O3

bool __thiscall LEFReader::parseOrigin(LEFReader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  token_t tVar3;
  int *piVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  _Alloc_hider __nptr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string xnum;
  string ynum;
  string local_a0;
  int local_7c;
  string local_78;
  double local_58;
  string local_50;
  
  paVar8 = &local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)paVar8;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  tVar3 = tokenize(this,&local_78);
  this->m_curtok = tVar3;
  __nptr._M_p = (pointer)paVar8;
  if (tVar3 == TOK_NUMBER) {
    tVar3 = tokenize(this,&local_50);
    this->m_curtok = tVar3;
    if (tVar3 == TOK_NUMBER) {
      tVar3 = tokenize(this,&this->m_tokstr);
      __nptr._M_p = local_78._M_dataplus._M_p;
      this->m_curtok = tVar3;
      if (tVar3 == TOK_SEMICOL) {
        piVar4 = __errno_location();
        local_7c = *piVar4;
        *piVar4 = 0;
        local_58 = strtod(__nptr._M_p,(char **)&local_a0);
        _Var2._M_p = local_50._M_dataplus._M_p;
        if (local_a0._M_dataplus._M_p == __nptr._M_p) {
          std::__throw_invalid_argument("stod");
          goto LAB_0012c3c2;
        }
        iVar7 = *piVar4;
        if (iVar7 == 0) {
          *piVar4 = local_7c;
          iVar7 = local_7c;
        }
        else if (iVar7 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_0012c26d;
        }
        *piVar4 = 0;
        strtod(local_50._M_dataplus._M_p,(char **)&local_a0);
        if (local_a0._M_dataplus._M_p == _Var2._M_p) {
LAB_0012c3c2:
          uVar5 = std::__throw_invalid_argument("stod");
          if ((int *)local_a0._M_dataplus._M_p != piVar4) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p,
                            CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                     local_50.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,
                            CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                     local_78.field_2._M_local_buf[0]) + 1);
          }
          _Unwind_Resume(uVar5);
        }
        paVar8 = &local_78.field_2;
        if (*piVar4 == 0) {
LAB_0012c39c:
          *piVar4 = iVar7;
        }
        else if (*piVar4 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_0012c39c;
        }
        bVar6 = true;
        (*this->_vptr_LEFReader[4])(local_58,this);
        goto LAB_0012c314;
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Expected a semicolon\n","");
      error(this,&local_a0);
    }
    else {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Expected a number\n","");
      error(this,&local_a0);
    }
  }
  else {
LAB_0012c26d:
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Expected a number\n","");
    error(this,&local_a0);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)__nptr._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  bVar6 = false;
LAB_0012c314:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar8) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return bVar6;
}

Assistant:

bool LEFReader::parseOrigin()
{
    // ORIGIN <number> <number> ; 

    
    std::string xnum;
    std::string ynum;

    m_curtok = tokenize(xnum);
    if (m_curtok != TOK_NUMBER)
    {
        error("Expected a number\n");
        return false;
    }

    m_curtok = tokenize(ynum);
    if (m_curtok != TOK_NUMBER)
    {
        error("Expected a number\n");
        return false;
    }

    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_SEMICOL)
    {
        error("Expected a semicolon\n");
        return false;
    }

    double xnumd, ynumd;
    try
    {
        xnumd = std::stod(xnum);
        ynumd = std::stod(ynum);
    }
    catch(const std::invalid_argument& ia)
    {
        error(ia.what());
    }

    onOrigin(xnumd, ynumd);

    //std::cout << "  ORIGIN " << xnum << " " << ynum << "\n";

    return true;
}